

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O3

void __thiscall leveldb::FindFileTest_Multiple_Test::TestBody(FindFileTest_Multiple_Test *this)

{
  internal iVar1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  bool bVar3;
  int iVar4;
  AssertionResult *this_00;
  char *pcVar5;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_60;
  AssertionResult local_58;
  internal local_48 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  undefined1 local_38 [16];
  AssertHelper local_28;
  
  FindFileTest::Add(&this->super_FindFileTest,"150","200",100,100);
  FindFileTest::Add(&this->super_FindFileTest,"200","250",100,100);
  FindFileTest::Add(&this->super_FindFileTest,"300","350",100,100);
  FindFileTest::Add(&this->super_FindFileTest,"400","450",100,100);
  local_58._0_4_ = 0;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"100");
  testing::internal::CmpHelperEQ<int,int>
            (local_48,"0","Find(\"100\")",(int *)&local_58,(int *)&local_60);
  iVar1 = local_48[0];
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_40._M_head_impl ==
        (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_40._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x61,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  _Var2._M_head_impl = local_40._M_head_impl;
  if (local_40._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)&(local_40._M_head_impl)->_M_dataplus !=
        &(local_40._M_head_impl)->field_2) {
      operator_delete(*(undefined8 **)&(local_40._M_head_impl)->_M_dataplus);
    }
    operator_delete(_Var2._M_head_impl);
  }
  if (iVar1 == (internal)0x0) {
    return;
  }
  local_58._0_4_ = 0;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"150");
  testing::internal::CmpHelperEQ<int,int>
            (local_48,"0","Find(\"150\")",(int *)&local_58,(int *)&local_60);
  iVar1 = local_48[0];
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_40._M_head_impl)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x62,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  _Var2._M_head_impl = local_40._M_head_impl;
  if (local_40._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)&(local_40._M_head_impl)->_M_dataplus !=
        &(local_40._M_head_impl)->field_2) {
      operator_delete(*(undefined8 **)&(local_40._M_head_impl)->_M_dataplus);
    }
    operator_delete(_Var2._M_head_impl);
  }
  if (iVar1 == (internal)0x0) {
    return;
  }
  local_58._0_4_ = 0;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"151");
  testing::internal::CmpHelperEQ<int,int>
            (local_48,"0","Find(\"151\")",(int *)&local_58,(int *)&local_60);
  iVar1 = local_48[0];
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_40._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_40._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,99,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  _Var2._M_head_impl = local_40._M_head_impl;
  if (local_40._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)local_40._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)local_40._M_head_impl + 0x10)) {
      operator_delete(*(undefined8 **)local_40._M_head_impl);
    }
    operator_delete(_Var2._M_head_impl);
  }
  if (iVar1 == (internal)0x0) {
    return;
  }
  local_58._0_4_ = 0;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"199");
  testing::internal::CmpHelperEQ<int,int>
            (local_48,"0","Find(\"199\")",(int *)&local_58,(int *)&local_60);
  iVar1 = local_48[0];
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_40._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,100,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  _Var2._M_head_impl = local_40._M_head_impl;
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_40._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)&(local_40._M_head_impl)->_M_dataplus !=
        &(local_40._M_head_impl)->field_2) {
      operator_delete(*(undefined8 **)&(local_40._M_head_impl)->_M_dataplus);
    }
    operator_delete(_Var2._M_head_impl);
  }
  if (iVar1 == (internal)0x0) {
    return;
  }
  local_58._0_4_ = 0;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"200");
  testing::internal::CmpHelperEQ<int,int>
            (local_48,"0","Find(\"200\")",(int *)&local_58,(int *)&local_60);
  iVar1 = local_48[0];
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_40._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_40._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x65,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  _Var2._M_head_impl = local_40._M_head_impl;
  if (local_40._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)local_40._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)local_40._M_head_impl + 0x10)) {
      operator_delete(*(undefined8 **)local_40._M_head_impl);
    }
    operator_delete(_Var2._M_head_impl);
  }
  if (iVar1 == (internal)0x0) {
    return;
  }
  local_58._0_4_ = 1;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"201");
  testing::internal::CmpHelperEQ<int,int>
            (local_48,"1","Find(\"201\")",(int *)&local_58,(int *)&local_60);
  iVar1 = local_48[0];
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_40._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_40._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x66,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
    }
  }
  _Var2._M_head_impl = local_40._M_head_impl;
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_40._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined8 **)&(local_40._M_head_impl)->_M_dataplus !=
        &(local_40._M_head_impl)->field_2) {
      operator_delete(*(undefined8 **)&(local_40._M_head_impl)->_M_dataplus);
    }
    operator_delete(_Var2._M_head_impl);
  }
  if (iVar1 == (internal)0x0) {
    return;
  }
  local_58._0_4_ = 1;
  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"249");
  testing::internal::CmpHelperEQ<int,int>
            (local_48,"1","Find(\"249\")",(int *)&local_58,(int *)&local_60);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_40._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_40._M_head_impl;
    }
    iVar4 = 0x67;
  }
  else {
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
    local_58._0_4_ = 1;
    local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"250");
    testing::internal::CmpHelperEQ<int,int>
              (local_48,"1","Find(\"250\")",(int *)&local_58,(int *)&local_60);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_58);
      if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_40._M_head_impl ==
          (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((local_40._M_head_impl)->_M_dataplus)._M_p;
      }
      iVar4 = 0x68;
    }
    else {
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
      local_58._0_4_ = 2;
      local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"251");
      testing::internal::CmpHelperEQ<int,int>
                (local_48,"2","Find(\"251\")",(int *)&local_58,(int *)&local_60);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_58);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_40._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_40._M_head_impl;
        }
        iVar4 = 0x69;
      }
      else {
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
        local_58._0_4_ = 2;
        local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"299");
        testing::internal::CmpHelperEQ<int,int>
                  (local_48,"2","Find(\"299\")",(int *)&local_58,(int *)&local_60);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_58);
          if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )local_40._M_head_impl ==
              (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((local_40._M_head_impl)->_M_dataplus)._M_p;
          }
          iVar4 = 0x6a;
        }
        else {
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
          local_58._0_4_ = 2;
          local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"300");
          testing::internal::CmpHelperEQ<int,int>
                    (local_48,"2","Find(\"300\")",(int *)&local_58,(int *)&local_60);
          if (local_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_58);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )local_40._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = *(char **)local_40._M_head_impl;
            }
            iVar4 = 0x6b;
          }
          else {
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
            local_58._0_4_ = 2;
            local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"349");
            testing::internal::CmpHelperEQ<int,int>
                      (local_48,"2","Find(\"349\")",(int *)&local_58,(int *)&local_60);
            if (local_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_58);
              if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   )local_40._M_head_impl ==
                  (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   )0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = ((local_40._M_head_impl)->_M_dataplus)._M_p;
              }
              iVar4 = 0x6c;
            }
            else {
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
              local_58._0_4_ = 2;
              local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"350");
              testing::internal::CmpHelperEQ<int,int>
                        (local_48,"2","Find(\"350\")",(int *)&local_58,(int *)&local_60);
              if (local_48[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_58);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )local_40._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar5 = "";
                }
                else {
                  pcVar5 = *(char **)local_40._M_head_impl;
                }
                iVar4 = 0x6d;
              }
              else {
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
                local_58._0_4_ = 3;
                local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"351");
                testing::internal::CmpHelperEQ<int,int>
                          (local_48,"3","Find(\"351\")",(int *)&local_58,(int *)&local_60);
                if (local_48[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_58);
                  if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       )local_40._M_head_impl ==
                      (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       )0x0) {
                    pcVar5 = "";
                  }
                  else {
                    pcVar5 = ((local_40._M_head_impl)->_M_dataplus)._M_p;
                  }
                  iVar4 = 0x6e;
                }
                else {
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
                  local_58._0_4_ = 3;
                  local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"400");
                  testing::internal::CmpHelperEQ<int,int>
                            (local_48,"3","Find(\"400\")",(int *)&local_58,(int *)&local_60);
                  if (local_48[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_58);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )local_40._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar5 = "";
                    }
                    else {
                      pcVar5 = *(char **)local_40._M_head_impl;
                    }
                    iVar4 = 0x6f;
                  }
                  else {
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
                    local_58._0_4_ = 3;
                    local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"450");
                    testing::internal::CmpHelperEQ<int,int>
                              (local_48,"3","Find(\"450\")",(int *)&local_58,(int *)&local_60);
                    if (local_48[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_58);
                      if ((_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           )local_40._M_head_impl ==
                          (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           )0x0) {
                        pcVar5 = "";
                      }
                      else {
                        pcVar5 = ((local_40._M_head_impl)->_M_dataplus)._M_p;
                      }
                      iVar4 = 0x70;
                    }
                    else {
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
                      local_58._0_4_ = 4;
                      local_60.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"451");
                      testing::internal::CmpHelperEQ<int,int>
                                (local_48,"4","Find(\"451\")",(int *)&local_58,(int *)&local_60);
                      if (local_48[0] != (internal)0x0) {
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
                        bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"100","149");
                        local_58.success_ = !bVar3;
                        local_58.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )0x0;
                        if (!bVar3) {
                          testing::AssertionResult::~AssertionResult(&local_58);
                          bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"251","299");
                          local_58.success_ = !bVar3;
                          local_58.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          if (bVar3) {
                            testing::Message::Message((Message *)&local_60);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_48,(internal *)&local_58,
                                       (AssertionResult *)"!Overlaps(\"251\", \"299\")","false",
                                       "true",in_R9);
                            pcVar5 = (char *)CONCAT71(local_48._1_7_,local_48[0]);
                            iVar4 = 0x74;
                            goto LAB_0010d8c3;
                          }
                          testing::AssertionResult::~AssertionResult(&local_58);
                          bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"451","500");
                          local_58.success_ = !bVar3;
                          local_58.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          if (bVar3) {
                            testing::Message::Message((Message *)&local_60);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_48,(internal *)&local_58,
                                       (AssertionResult *)"!Overlaps(\"451\", \"500\")","false",
                                       "true",in_R9);
                            pcVar5 = (char *)CONCAT71(local_48._1_7_,local_48[0]);
                            iVar4 = 0x75;
                            goto LAB_0010d8c3;
                          }
                          testing::AssertionResult::~AssertionResult(&local_58);
                          bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"351","399");
                          local_58.success_ = !bVar3;
                          local_58.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          if (bVar3) {
                            testing::Message::Message((Message *)&local_60);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_48,(internal *)&local_58,
                                       (AssertionResult *)"!Overlaps(\"351\", \"399\")","false",
                                       "true",in_R9);
                            pcVar5 = (char *)CONCAT71(local_48._1_7_,local_48[0]);
                            iVar4 = 0x76;
                            goto LAB_0010d8c3;
                          }
                          testing::AssertionResult::~AssertionResult(&local_58);
                          bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"100","150");
                          local_58.success_ = bVar3;
                          local_58.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          if (!bVar3) {
                            testing::Message::Message((Message *)&local_60);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_48,(internal *)&local_58,
                                       (AssertionResult *)"Overlaps(\"100\", \"150\")","false",
                                       "true",in_R9);
                            pcVar5 = (char *)CONCAT71(local_48._1_7_,local_48[0]);
                            iVar4 = 0x78;
                            goto LAB_0010d8c3;
                          }
                          testing::AssertionResult::~AssertionResult(&local_58);
                          bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"100","200");
                          local_58.success_ = bVar3;
                          local_58.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          if (!bVar3) {
                            testing::Message::Message((Message *)&local_60);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_48,(internal *)&local_58,
                                       (AssertionResult *)"Overlaps(\"100\", \"200\")","false",
                                       "true",in_R9);
                            pcVar5 = (char *)CONCAT71(local_48._1_7_,local_48[0]);
                            iVar4 = 0x79;
                            goto LAB_0010d8c3;
                          }
                          testing::AssertionResult::~AssertionResult(&local_58);
                          bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"100","300");
                          local_58.success_ = bVar3;
                          local_58.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          if (!bVar3) {
                            testing::Message::Message((Message *)&local_60);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_48,(internal *)&local_58,
                                       (AssertionResult *)"Overlaps(\"100\", \"300\")","false",
                                       "true",in_R9);
                            pcVar5 = (char *)CONCAT71(local_48._1_7_,local_48[0]);
                            iVar4 = 0x7a;
                            goto LAB_0010d8c3;
                          }
                          testing::AssertionResult::~AssertionResult(&local_58);
                          bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"100","400");
                          local_58.success_ = bVar3;
                          local_58.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          if (!bVar3) {
                            testing::Message::Message((Message *)&local_60);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_48,(internal *)&local_58,
                                       (AssertionResult *)"Overlaps(\"100\", \"400\")","false",
                                       "true",in_R9);
                            pcVar5 = (char *)CONCAT71(local_48._1_7_,local_48[0]);
                            iVar4 = 0x7b;
                            goto LAB_0010d8c3;
                          }
                          testing::AssertionResult::~AssertionResult(&local_58);
                          bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"100","500");
                          local_58.success_ = bVar3;
                          local_58.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          if (!bVar3) {
                            testing::Message::Message((Message *)&local_60);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_48,(internal *)&local_58,
                                       (AssertionResult *)"Overlaps(\"100\", \"500\")","false",
                                       "true",in_R9);
                            pcVar5 = (char *)CONCAT71(local_48._1_7_,local_48[0]);
                            iVar4 = 0x7c;
                            goto LAB_0010d8c3;
                          }
                          testing::AssertionResult::~AssertionResult(&local_58);
                          bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"375","400");
                          local_58.success_ = bVar3;
                          local_58.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          if (!bVar3) {
                            testing::Message::Message((Message *)&local_60);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_48,(internal *)&local_58,
                                       (AssertionResult *)"Overlaps(\"375\", \"400\")","false",
                                       "true",in_R9);
                            pcVar5 = (char *)CONCAT71(local_48._1_7_,local_48[0]);
                            iVar4 = 0x7d;
                            goto LAB_0010d8c3;
                          }
                          testing::AssertionResult::~AssertionResult(&local_58);
                          bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"450","450");
                          local_58.success_ = bVar3;
                          local_58.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          if (!bVar3) {
                            testing::Message::Message((Message *)&local_60);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_48,(internal *)&local_58,
                                       (AssertionResult *)"Overlaps(\"450\", \"450\")","false",
                                       "true",in_R9);
                            pcVar5 = (char *)CONCAT71(local_48._1_7_,local_48[0]);
                            iVar4 = 0x7e;
                            goto LAB_0010d8c3;
                          }
                          testing::AssertionResult::~AssertionResult(&local_58);
                          bVar3 = FindFileTest::Overlaps(&this->super_FindFileTest,"450","500");
                          local_58.success_ = bVar3;
                          local_58.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          if (!bVar3) {
                            testing::Message::Message((Message *)&local_60);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_48,(internal *)&local_58,
                                       (AssertionResult *)"Overlaps(\"450\", \"500\")","false",
                                       "true",in_R9);
                            pcVar5 = (char *)CONCAT71(local_48._1_7_,local_48[0]);
                            iVar4 = 0x7f;
                            goto LAB_0010d8c3;
                          }
                        }
                        else {
                          testing::Message::Message((Message *)&local_60);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_48,(internal *)&local_58,
                                     (AssertionResult *)"!Overlaps(\"100\", \"149\")","false","true"
                                     ,in_R9);
                          pcVar5 = (char *)CONCAT71(local_48._1_7_,local_48[0]);
                          iVar4 = 0x73;
LAB_0010d8c3:
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_28,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                     ,iVar4,pcVar5);
                          testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_28);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_48._1_7_,local_48[0]) !=
                              &((string *)local_48)->field_2) {
                            operator_delete((void *)CONCAT71(local_48._1_7_,local_48[0]));
                          }
                          if ((long *)CONCAT44(local_60.data_._4_4_,(int)local_60.data_) !=
                              (long *)0x0) {
                            (**(code **)(*(long *)CONCAT44(local_60.data_._4_4_,(int)local_60.data_)
                                        + 8))();
                          }
                        }
                        this_00 = &local_58;
                        goto LAB_0010d359;
                      }
                      testing::Message::Message((Message *)&local_58);
                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )local_40._M_head_impl ==
                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )0x0) {
                        pcVar5 = "";
                      }
                      else {
                        pcVar5 = *(char **)local_40._M_head_impl;
                      }
                      iVar4 = 0x71;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_60,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
             ,iVar4,pcVar5);
  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  if ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
  }
  this_00 = (AssertionResult *)local_48;
LAB_0010d359:
  testing::AssertionResult::~AssertionResult(this_00);
  return;
}

Assistant:

TEST_F(FindFileTest, Multiple) {
  Add("150", "200");
  Add("200", "250");
  Add("300", "350");
  Add("400", "450");
  ASSERT_EQ(0, Find("100"));
  ASSERT_EQ(0, Find("150"));
  ASSERT_EQ(0, Find("151"));
  ASSERT_EQ(0, Find("199"));
  ASSERT_EQ(0, Find("200"));
  ASSERT_EQ(1, Find("201"));
  ASSERT_EQ(1, Find("249"));
  ASSERT_EQ(1, Find("250"));
  ASSERT_EQ(2, Find("251"));
  ASSERT_EQ(2, Find("299"));
  ASSERT_EQ(2, Find("300"));
  ASSERT_EQ(2, Find("349"));
  ASSERT_EQ(2, Find("350"));
  ASSERT_EQ(3, Find("351"));
  ASSERT_EQ(3, Find("400"));
  ASSERT_EQ(3, Find("450"));
  ASSERT_EQ(4, Find("451"));

  ASSERT_TRUE(!Overlaps("100", "149"));
  ASSERT_TRUE(!Overlaps("251", "299"));
  ASSERT_TRUE(!Overlaps("451", "500"));
  ASSERT_TRUE(!Overlaps("351", "399"));

  ASSERT_TRUE(Overlaps("100", "150"));
  ASSERT_TRUE(Overlaps("100", "200"));
  ASSERT_TRUE(Overlaps("100", "300"));
  ASSERT_TRUE(Overlaps("100", "400"));
  ASSERT_TRUE(Overlaps("100", "500"));
  ASSERT_TRUE(Overlaps("375", "400"));
  ASSERT_TRUE(Overlaps("450", "450"));
  ASSERT_TRUE(Overlaps("450", "500"));
}